

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

Duration __thiscall
absl::lts_20250127::anon_unknown_1::MakeDurationFromU128
          (anon_unknown_1 *this,uint128 u128,bool is_neg)

{
  uint128 lhs;
  uint128 lhs_00;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint128 uVar4;
  Duration DVar5;
  HiRep local_198;
  uint32_t local_190;
  uint128 hi_1;
  uint128 kTicksPerSecond128;
  uint32_t local_e0;
  HiRep local_d8;
  uint32_t local_d0;
  HiRep local_98;
  uint32_t local_90;
  uint64_t kMaxRepHi64;
  uint64_t hi;
  uint64_t l64;
  uint64_t h64;
  ulong uStack_38;
  uint32_t rep_lo;
  int64_t rep_hi;
  bool is_neg_local;
  uint128 u128_local;
  uint32_t uStack_10;
  uint32_t local_c;
  
  uVar3 = u128.lo_;
  uVar1 = Uint128High64((lts_20250127 *)this,u128);
  uVar4.hi_ = uVar3;
  uVar4.lo_ = (uint64_t)this;
  uVar2 = Uint128Low64(uVar4);
  if (uVar1 == 0) {
    uStack_38 = uVar2 / 4000000000;
    h64._4_4_ = (int)uVar2 + (int)uStack_38 * 0x1194d800;
  }
  else {
    if (1999999999 < uVar1) {
      if (((((undefined1  [16])u128 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
          (uVar1 != 2000000000)) || (uVar2 != 0)) {
        if (((undefined1  [16])u128 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          DVar5 = InfiniteDuration();
          kTicksPerSecond128.hi_ = (uint64_t)DVar5.rep_hi_;
          u128_local.hi_._4_4_ = (undefined4)kTicksPerSecond128.hi_;
          uStack_10 = kTicksPerSecond128.hi_._4_4_;
          local_e0 = DVar5.rep_lo_;
          local_c = local_e0;
        }
        else {
          DVar5 = InfiniteDuration();
          DVar5 = lts_20250127::operator-(DVar5);
          local_d8 = DVar5.rep_hi_;
          stack0xffffffffffffffec = local_d8;
          local_d0 = DVar5.rep_lo_;
          local_c = local_d0;
        }
      }
      else {
        DVar5 = time_internal::MakeDuration(-0x8000000000000000,0);
        local_98 = DVar5.rep_hi_;
        stack0xffffffffffffffec = local_98;
        local_90 = DVar5.rep_lo_;
        local_c = local_90;
      }
      goto LAB_008df16e;
    }
    lhs_00.hi_ = uVar3;
    lhs_00.lo_ = (uint64_t)this;
    uVar4 = operator/(lhs_00,(uint128)ZEXT816(4000000000));
    uStack_38 = Uint128Low64(uVar4);
    uVar4 = lts_20250127::operator*(uVar4,(uint128)ZEXT816(4000000000));
    lhs.hi_ = uVar3;
    lhs.lo_ = (uint64_t)this;
    uVar4 = lts_20250127::operator-(lhs,uVar4);
    uVar1 = Uint128Low64(uVar4);
    h64._4_4_ = (uint32_t)uVar1;
  }
  if ((((undefined1  [16])u128 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
     (uStack_38 = -uStack_38, h64._4_4_ != 0)) {
    uStack_38 = uStack_38 - 1;
    h64._4_4_ = 4000000000 - h64._4_4_;
  }
  DVar5 = time_internal::MakeDuration(uStack_38,h64._4_4_);
  local_198 = DVar5.rep_hi_;
  stack0xffffffffffffffec = local_198;
  local_190 = DVar5.rep_lo_;
  local_c = local_190;
LAB_008df16e:
  DVar5.rep_lo_ = local_c;
  DVar5.rep_hi_ = stack0xffffffffffffffec;
  return DVar5;
}

Assistant:

inline Duration MakeDurationFromU128(uint128 u128, bool is_neg) {
  int64_t rep_hi;
  uint32_t rep_lo;
  const uint64_t h64 = Uint128High64(u128);
  const uint64_t l64 = Uint128Low64(u128);
  if (h64 == 0) {  // fastpath
    const uint64_t hi = l64 / kTicksPerSecond;
    rep_hi = static_cast<int64_t>(hi);
    rep_lo = static_cast<uint32_t>(l64 - hi * kTicksPerSecond);
  } else {
    // kMaxRepHi64 is the high 64 bits of (2^63 * kTicksPerSecond).
    // Any positive tick count whose high 64 bits are >= kMaxRepHi64
    // is not representable as a Duration.  A negative tick count can
    // have its high 64 bits == kMaxRepHi64 but only when the low 64
    // bits are all zero, otherwise it is not representable either.
    const uint64_t kMaxRepHi64 = 0x77359400UL;
    if (h64 >= kMaxRepHi64) {
      if (is_neg && h64 == kMaxRepHi64 && l64 == 0) {
        // Avoid trying to represent -kint64min below.
        return time_internal::MakeDuration(kint64min);
      }
      return is_neg ? -InfiniteDuration() : InfiniteDuration();
    }
    const uint128 kTicksPerSecond128 = static_cast<uint64_t>(kTicksPerSecond);
    const uint128 hi = u128 / kTicksPerSecond128;
    rep_hi = static_cast<int64_t>(Uint128Low64(hi));
    rep_lo =
        static_cast<uint32_t>(Uint128Low64(u128 - hi * kTicksPerSecond128));
  }
  if (is_neg) {
    rep_hi = -rep_hi;
    if (rep_lo != 0) {
      --rep_hi;
      rep_lo = kTicksPerSecond - rep_lo;
    }
  }
  return time_internal::MakeDuration(rep_hi, rep_lo);
}